

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HeapInfo.cpp
# Opt level: O3

void __thiscall Memory::HeapInfo::Finalize(HeapInfo *this,RecyclerSweep *recyclerSweep)

{
  Recycler *pRVar1;
  long lVar2;
  
  pRVar1 = RecyclerSweep::GetRecycler(recyclerSweep);
  (pRVar1->collectionStats).numEmptySmallBlocks[0] = 0;
  (pRVar1->collectionStats).numEmptySmallBlocks[1] = 0;
  (pRVar1->collectionStats).numEmptySmallBlocks[2] = 0;
  (pRVar1->collectionStats).numEmptySmallBlocks[3] = 0;
  (pRVar1->collectionStats).numEmptySmallBlocks[4] = 0;
  (pRVar1->collectionStats).numEmptySmallBlocks[5] = 0;
  (pRVar1->collectionStats).numEmptySmallBlocks[6] = 0;
  (pRVar1->collectionStats).numEmptySmallBlocks[7] = 0;
  (pRVar1->collectionStats).numEmptySmallBlocks[8] = 0;
  (pRVar1->collectionStats).numEmptySmallBlocks[9] = 0;
  *(undefined8 *)((pRVar1->collectionStats).numEmptySmallBlocks + 10) = 0;
  this->newFinalizableObjectCount = 0;
  GetSmallHeapBlockCount(this,true);
  RecyclerSweep::
  MergePendingNewHeapBlockList<Memory::SmallFinalizableHeapBlockT<SmallAllocationBlockAttributes>>
            (recyclerSweep);
  RecyclerSweep::
  MergePendingNewMediumHeapBlockList<Memory::SmallFinalizableHeapBlockT<MediumAllocationBlockAttributes>>
            (recyclerSweep);
  RecyclerSweep::
  MergePendingNewHeapBlockList<Memory::SmallFinalizableWithBarrierHeapBlockT<SmallAllocationBlockAttributes>>
            (recyclerSweep);
  RecyclerSweep::
  MergePendingNewMediumHeapBlockList<Memory::SmallFinalizableWithBarrierHeapBlockT<MediumAllocationBlockAttributes>>
            (recyclerSweep);
  LargeHeapBucket::Finalize(&this->largeObjectBucket);
  lVar2 = 0x78;
  do {
    HeapBucketGroup<SmallAllocationBlockAttributes>::SweepFinalizableObjects
              ((HeapBucketGroup<SmallAllocationBlockAttributes> *)
               ((long)&((HeapInfo *)(&this->smallBlockPageHeapBucketFilter + -0xc))->recycler +
               lVar2),recyclerSweep);
    lVar2 = lVar2 + 0x380;
  } while (lVar2 != 0xa878);
  lVar2 = 0;
  do {
    HeapBucketGroup<MediumAllocationBlockAttributes>::SweepFinalizableObjects
              ((HeapBucketGroup<MediumAllocationBlockAttributes> *)
               ((long)&this->mediumHeapBuckets[0].heapBucket.
                       super_SmallNormalHeapBucketBase<Memory::SmallNormalHeapBlockT<MediumAllocationBlockAttributes>_>
                       .
                       super_HeapBucketT<Memory::SmallNormalHeapBlockT<MediumAllocationBlockAttributes>_>
                       .super_HeapBucket.heapInfo + lVar2),recyclerSweep);
    lVar2 = lVar2 + 0x380;
  } while (lVar2 != 0x6580);
  return;
}

Assistant:

void
HeapInfo::Finalize(RecyclerSweep& recyclerSweep)
{
    Recycler * recycler = recyclerSweep.GetRecycler();
#ifdef RECYCLER_STATS
    memset(&recycler->collectionStats.numEmptySmallBlocks, 0, sizeof(recycler->collectionStats.numEmptySmallBlocks));
    recycler->collectionStats.numZeroedOutSmallBlocks = 0;
#endif
#ifdef RECYCLER_FINALIZE_CHECK
    this->newFinalizableObjectCount = 0;
#endif
    RECYCLER_SLOW_CHECK(VerifySmallHeapBlockCount());

#if ENABLE_CONCURRENT_GC
    // Merge the new blocks before we sweep the finalizable object in thread
    recyclerSweep.MergePendingNewHeapBlockList<SmallFinalizableHeapBlock>();
    recyclerSweep.MergePendingNewMediumHeapBlockList<MediumFinalizableHeapBlock>();

#ifdef RECYCLER_WRITE_BARRIER
    recyclerSweep.MergePendingNewHeapBlockList<SmallFinalizableWithBarrierHeapBlock>();
    recyclerSweep.MergePendingNewMediumHeapBlockList<MediumFinalizableWithBarrierHeapBlock>();
#endif
#ifdef RECYCLER_VISITED_HOST
    recyclerSweep.MergePendingNewHeapBlockList<SmallRecyclerVisitedHostHeapBlock>();
    recyclerSweep.MergePendingNewMediumHeapBlockList<MediumRecyclerVisitedHostHeapBlock>();
#endif
#endif

    RECYCLER_PROFILE_EXEC_BEGIN(recycler, Js::FinalizePhase);    

    largeObjectBucket.Finalize();

#if defined(BUCKETIZE_MEDIUM_ALLOCATIONS) && !(SMALLBLOCK_MEDIUM_ALLOC)
    for (uint i = 0; i < HeapConstants::MediumBucketCount; i++)
    {
        mediumHeapBuckets[i].Finalize();
    }
#endif

    for (uint i = 0; i < HeapConstants::BucketCount; i++)
    {
        heapBuckets[i].SweepFinalizableObjects(recyclerSweep);
    }

#if defined(BUCKETIZE_MEDIUM_ALLOCATIONS) && SMALLBLOCK_MEDIUM_ALLOC
    // CONCURRENT-TODO: Allow this in the background as well
    for (uint i = 0; i < HeapConstants::MediumBucketCount; i++)
    {
        mediumHeapBuckets[i].SweepFinalizableObjects(recyclerSweep);
    }
#endif

    RECYCLER_PROFILE_EXEC_END(recycler, Js::FinalizePhase);
}